

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

void __thiscall rw::Raster::subRaster(Raster *this,Raster *parent,Rect *r)

{
  if ((this->flags & 0x80) != 0) {
    this->width = r->w;
    this->height = r->h;
    this->offsetX = r->x + parent->offsetX;
    this->offsetY = r->y + parent->offsetY;
    this->parent = parent->parent;
  }
  return;
}

Assistant:

void
Raster::subRaster(Raster *parent, Rect *r)
{
	if((this->flags & DONTALLOCATE) == 0)
		return;
	this->width = r->w;
	this->height = r->h;
	this->offsetX = parent->offsetX + r->x;
	this->offsetY = parent->offsetY + r->y;
	this->parent = parent->parent;
}